

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ffqr_df_mipsel(CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  float_status *pfVar1;
  fpr_t *pfVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  float32 fVar8;
  float64 fVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float64 *pfVar16;
  float_status *status;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  
  lVar4 = (ulong)ws * 0x10 + 0x228;
  if (df == 2) {
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar10 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = int32_to_float32_mipsel
                        ((int)*(short *)((long)(env->active_fpu).fpr + lVar10 * 2 + lVar4 + -0x228),
                         pfVar1);
      fVar8 = float32_scalbn_mipsel(fVar8,-0xf,pfVar1);
      *(float32 *)((long)afStack_40 + lVar10 * 4 + -8) = fVar8;
      if ((fVar8 & 0x7fffffff) == 0) {
        uVar15 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar15 = (uint)bVar3;
        if ((fVar8 & 0x7f800000) == 0) {
          uVar15 = bVar3 | 0x10;
        }
      }
      uVar6 = ieee_ex_to_mips_mipsel(uVar15);
      uVar11 = (env->active_tc).msacsr;
      uVar14 = (uVar11 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar13 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar13 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar13 = uVar14;
      }
      uVar13 = uVar13 | uVar6;
      uVar7 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar14 = uVar7 | uVar13;
      uVar15 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar15 = uVar14;
      }
      if ((uVar13 & 2) == 0) {
        uVar15 = uVar14;
      }
      if ((uVar15 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar15 << 0xc;
LAB_0081a919:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar15) != 0) goto LAB_0081a934;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar13 = uVar15 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_0081a919;
        }
LAB_0081a934:
        fVar8 = float32_default_nan_mipsel(pfVar1);
        *(float32 *)((long)afStack_40 + lVar10 * 4 + -8) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar15;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c79,
                    "void helper_msa_ffqr_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar1 = &(env->active_tc).msa_fp_status;
    pfVar16 = &local_48;
    lVar10 = 0;
    bVar5 = true;
    do {
      bVar12 = bVar5;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = int32_to_float64_mipsel
                        (*(int32_t *)((long)(env->active_fpu).fpr + lVar10 * 4 + lVar4 + -0x228),
                         pfVar1);
      fVar9 = float64_scalbn_mipsel(fVar9,-0x1f,pfVar1);
      *pfVar16 = fVar9;
      if ((fVar9 & 0x7fffffffffffffff) == 0) {
        uVar15 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar15 = (uint)bVar3;
        if ((fVar9 & 0x7ff0000000000000) == 0) {
          uVar15 = bVar3 | 0x10;
        }
      }
      uVar6 = ieee_ex_to_mips_mipsel(uVar15);
      uVar11 = (env->active_tc).msacsr;
      uVar14 = (uVar11 & 0x1000000) >> 0x18 & uVar15 >> 6;
      uVar13 = 3;
      if ((uVar11 & 0x1000000) == 0) {
        uVar13 = uVar14;
      }
      if (uVar15 < 0x80) {
        uVar13 = uVar14;
      }
      uVar13 = uVar13 | uVar6;
      uVar7 = (uint)((uVar11 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar14 = uVar7 | uVar13;
      uVar15 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar13 & 1) != 0) || (uVar11 & 0x100) != 0) {
        uVar15 = uVar14;
      }
      if ((uVar13 & 2) == 0) {
        uVar15 = uVar14;
      }
      if ((uVar15 & (uVar11 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar15 << 0xc;
LAB_0081a7c7:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar11;
        if (((uVar11 >> 7 & 0x1f | 0x20) & uVar15) != 0) goto LAB_0081a7e2;
      }
      else {
        if ((uVar11 >> 0x12 & 1) == 0) {
          uVar13 = uVar15 << 0xc | uVar11;
          uVar11 = uVar11 & 0xfff80fff;
          goto LAB_0081a7c7;
        }
LAB_0081a7e2:
        fVar9 = float64_default_nan_mipsel(pfVar1);
        *pfVar16 = (long)(int)uVar15 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar10 = 1;
      pfVar16 = afStack_40;
      bVar5 = false;
    } while (bVar12);
  }
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fd = local_48;
  (&pfVar2->fd)[1] = afStack_40[0];
  return;
}

Assistant:

void helper_msa_ffqr_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Rh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Rw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}